

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.h
# Opt level: O2

HandlerCallInstr * __thiscall
flow::IRBuilder::
insert<flow::HandlerCallInstr,flow::IRBuiltinHandler*&,std::vector<flow::Value*,std::allocator<flow::Value*>>const&>
          (IRBuilder *this,IRBuiltinHandler **args,
          vector<flow::Value_*,_std::allocator<flow::Value_*>_> *args_1)

{
  Instr *pIVar1;
  Instr *local_20;
  _Head_base<0UL,_flow::Instr_*,_false> local_18;
  
  std::
  make_unique<flow::HandlerCallInstr,flow::IRBuiltinHandler*,std::vector<flow::Value*,std::allocator<flow::Value*>>const>
            ((IRBuiltinHandler **)&local_20,
             (vector<flow::Value_*,_std::allocator<flow::Value_*>_> *)args);
  local_18._M_head_impl = local_20;
  local_20 = (Instr *)0x0;
  pIVar1 = insert(this,(unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *)&local_18);
  if (local_18._M_head_impl != (Instr *)0x0) {
    (*((local_18._M_head_impl)->super_Value)._vptr_Value[1])();
  }
  if (local_20 != (Instr *)0x0) {
    (*(local_20->super_Value)._vptr_Value[1])();
  }
  return (HandlerCallInstr *)pIVar1;
}

Assistant:

T* insert(Args&&... args) {
    return static_cast<T*>(insert(std::make_unique<T>(std::move(args)...)));
  }